

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popBuffer(GLES2ResourceManager *this,int index)

{
  reference other;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> SVar1;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>_>
  local_38;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>_>
  local_30;
  const_iterator local_28;
  undefined1 local_1d;
  int local_1c;
  long lStack_18;
  int index_local;
  GLES2ResourceManager *this_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer;
  
  lStack_18 = CONCAT44(in_register_00000034,index);
  local_1d = 0;
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
             *)(lStack_18 + 0x18);
  local_1c = in_EDX;
  this_local = this;
  other = std::
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
          ::operator[](this_00,(long)in_EDX);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)this,other);
  local_38._M_current =
       (SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)
       std::
       vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
       ::begin(this_00);
  local_30 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>_>
             ::operator+(&local_38,(long)local_1c);
  __gnu_cxx::
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>>>>
  ::__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>*>
            ((__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>>>>
              *)&local_28,&local_30);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
  ::erase(this_00,local_28);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (Buffer *)this;
  return SVar1;
}

Assistant:

SharedPtr<Buffer> GLES2ResourceManager::popBuffer (int index)
{
	SharedPtr<Buffer> buffer = m_buffers[index];

	m_buffers.erase(m_buffers.begin() + index);

	return buffer;
}